

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<char>::prepare_int_buffer<fmt::AlignSpec>
          (BasicWriter<char> *this,uint num_digits,AlignSpec *spec,char *prefix,uint prefix_size)

{
  byte bVar1;
  uint uVar2;
  Alignment AVar3;
  Buffer<char> *pBVar4;
  CharPtr pcVar5;
  size_t size;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t __len_1;
  ulong uVar11;
  size_t __len;
  ulong uVar12;
  ptrdiff_t _Num;
  AlignSpec subspec;
  AlignSpec local_44;
  size_t local_38;
  
  uVar2 = (spec->super_WidthSpec).width_;
  uVar11 = (ulong)uVar2;
  AVar3 = spec->align_;
  bVar1 = (byte)(spec->super_WidthSpec).fill_;
  if ((int)num_digits < -1) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    uVar8 = prefix_size - 1;
    local_44.super_WidthSpec.fill_ = L'0';
    local_44.align_ = ALIGN_NUMERIC;
    local_44.super_WidthSpec.width_ = uVar8;
    if (uVar2 <= uVar8) {
      pcVar5 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_44,prefix,prefix_size);
      return pcVar5;
    }
    if (this->buffer_->capacity_ < uVar11) {
      (**this->buffer_->_vptr_Buffer)();
    }
    uVar11 = (ulong)(uVar2 - uVar8);
    if (AVar3 != ALIGN_LEFT) {
      pBVar4 = this->buffer_;
      sVar10 = pBVar4->size_;
      uVar12 = sVar10 + uVar11;
      if (pBVar4->capacity_ < uVar12) {
        local_38 = sVar10;
        (**pBVar4->_vptr_Buffer)(pBVar4,uVar12);
        sVar10 = local_38;
      }
      pBVar4->size_ = uVar12;
      if (uVar2 != uVar8) {
        memset(this->buffer_->ptr_ + sVar10,(uint)bVar1,uVar11);
      }
    }
    pcVar5 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_44,prefix,prefix_size);
    if (AVar3 != ALIGN_LEFT) {
      return pcVar5;
    }
    pBVar4 = this->buffer_;
    sVar10 = pBVar4->size_;
    uVar12 = sVar10 + uVar11;
    if (pBVar4->capacity_ < uVar12) {
      (**pBVar4->_vptr_Buffer)(pBVar4,uVar12);
    }
    pBVar4->size_ = uVar12;
    if (uVar2 == uVar8) {
      return pcVar5;
    }
    memset(this->buffer_->ptr_ + sVar10,(uint)bVar1,uVar11);
    return pcVar5;
  }
  uVar8 = prefix_size + num_digits;
  pBVar4 = this->buffer_;
  sVar10 = pBVar4->size_;
  if (uVar2 <= uVar8) {
    uVar11 = sVar10 + uVar8;
    if (pBVar4->capacity_ < uVar11) {
      (**pBVar4->_vptr_Buffer)(pBVar4,uVar11);
    }
    pBVar4->size_ = uVar11;
    pcVar7 = this->buffer_->ptr_ + sVar10;
    if (prefix_size != 0) {
      memmove(pcVar7,prefix,(ulong)prefix_size);
    }
    pcVar7 = pcVar7 + uVar8;
    goto LAB_0012a808;
  }
  uVar12 = sVar10 + uVar11;
  if (pBVar4->capacity_ < uVar12) {
    (**pBVar4->_vptr_Buffer)(pBVar4,uVar12);
  }
  uVar9 = (ulong)uVar8;
  pBVar4->size_ = uVar12;
  pcVar6 = this->buffer_->ptr_ + sVar10;
  pcVar7 = pcVar6 + uVar11;
  if (AVar3 == ALIGN_NUMERIC) {
    if (prefix_size != 0) {
      memmove(pcVar6,prefix,(ulong)prefix_size);
      pcVar6 = pcVar6 + prefix_size;
      uVar8 = num_digits;
    }
  }
  else {
    if (AVar3 == ALIGN_CENTER) {
      uVar11 = uVar11 - uVar9;
      uVar12 = uVar11 >> 1;
      if (1 < uVar11) {
        memset(pcVar6,(uint)bVar1,uVar12);
      }
      pcVar6 = pcVar6 + uVar12;
      if (uVar2 != uVar8) {
        memset(pcVar6 + uVar9,(uint)bVar1,uVar11 - uVar12);
      }
      if (prefix_size != 0) {
        memmove(pcVar6,prefix,(ulong)prefix_size);
      }
      pcVar7 = pcVar6 + uVar9;
      goto LAB_0012a808;
    }
    if (AVar3 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        memmove(pcVar6,prefix,(ulong)prefix_size);
      }
      pcVar7 = pcVar6 + uVar9;
      if (uVar2 != uVar8) {
        memset(pcVar7,(uint)bVar1,uVar11 - uVar9);
      }
      goto LAB_0012a808;
    }
    if (prefix_size != 0) {
      memmove(pcVar7 + -uVar9,prefix,(ulong)prefix_size);
    }
  }
  if (pcVar7 + (-(long)pcVar6 - (ulong)uVar8) != (char *)0x0) {
    memset(pcVar6,(uint)bVar1,(size_t)(pcVar7 + (-(long)pcVar6 - (ulong)uVar8)));
  }
LAB_0012a808:
  return pcVar7 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}